

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::node_output_simple
               (xml_buffered_writer *writer,xml_node_struct *node,uint flags)

{
  size_t length;
  char cVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  char_t *pcVar6;
  ulong uVar7;
  char *pcVar8;
  char_t *pcVar9;
  
  switch((uint)node->header & 0xf) {
  case 3:
    pcVar5 = "";
    if (node->value != (char_t *)0x0) {
      pcVar5 = node->value;
    }
    text_output(writer,pcVar5,ctx_special_pcdata,flags);
    return;
  case 4:
    pcVar5 = "";
    if (node->value != (char_t *)0x0) {
      pcVar5 = node->value;
    }
LAB_001356f7:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x5b);
    xml_buffered_writer::write(writer,0x41,(void *)0x54,0x41);
    lVar3 = 0;
    pcVar6 = pcVar5;
    do {
      cVar1 = *pcVar6;
      if (cVar1 == ']') {
        if ((pcVar6[1] == ']') && (pcVar6[2] == '>')) goto LAB_00135761;
      }
      else if (cVar1 == '\0') goto LAB_00135761;
      pcVar6 = pcVar6 + 1;
      lVar3 = lVar3 + 1;
    } while( true );
  case 5:
    pcVar5 = "";
    if (node->value != (char *)0x0) {
      pcVar5 = node->value;
    }
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x2d);
LAB_001354de:
    cVar1 = *pcVar5;
    if (cVar1 != '\0') {
      sVar4 = 0;
      pcVar6 = pcVar5;
      do {
        pcVar8 = pcVar6 + 1;
        if (cVar1 == '-') {
          cVar1 = *pcVar8;
          if ((cVar1 == '\0') || (cVar1 == '-')) goto LAB_00135516;
        }
        else {
          if (cVar1 == '\0') goto LAB_00135516;
          cVar1 = *pcVar8;
        }
        sVar4 = sVar4 + 1;
        pcVar6 = pcVar8;
      } while( true );
    }
LAB_0013589a:
    uVar2 = writer->bufsize;
    if (0x7fd < uVar2) {
      xml_buffered_writer::flush(writer,writer->buffer,uVar2);
      uVar2 = 0;
    }
    (writer->buffer + uVar2)[0] = '-';
    (writer->buffer + uVar2)[1] = '-';
    writer->buffer[uVar2 + 2] = '>';
    sVar4 = uVar2 + 3;
    goto LAB_001358c6;
  case 6:
    uVar2 = writer->bufsize;
    if (0x7fe < uVar2) {
      xml_buffered_writer::flush(writer,writer->buffer,uVar2);
      uVar2 = 0;
    }
    (writer->buffer + uVar2)[0] = '<';
    (writer->buffer + uVar2)[1] = '?';
    writer->bufsize = uVar2 + 2;
    pcVar5 = ":anonymous";
    if (node->name != (char_t *)0x0) {
      pcVar5 = node->name;
    }
    xml_buffered_writer::write_string(writer,pcVar5);
    sVar4 = writer->bufsize;
    if (node->value != (char_t *)0x0) {
      if (0x7ff < sVar4) {
        xml_buffered_writer::flush(writer,writer->buffer,sVar4);
        sVar4 = 0;
      }
      writer->buffer[sVar4] = ' ';
      sVar4 = sVar4 + 1;
      writer->bufsize = sVar4;
      pcVar6 = node->value;
LAB_00135606:
      cVar1 = *pcVar6;
      if (cVar1 != '\0') {
        pcVar9 = pcVar6 + 2;
        length = 0;
        do {
          if (cVar1 == '?') {
            cVar1 = pcVar9[-1];
            if (cVar1 == '>') goto LAB_0013563d;
          }
          else {
            if (cVar1 == '\0') goto LAB_0013563d;
            cVar1 = pcVar9[-1];
          }
          pcVar9 = pcVar9 + 1;
          length = length + 1;
        } while( true );
      }
      break;
    }
    break;
  case 7:
    uVar2 = writer->bufsize;
    if (0x7fe < uVar2) {
      xml_buffered_writer::flush(writer,writer->buffer,uVar2);
      uVar2 = 0;
    }
    (writer->buffer + uVar2)[0] = '<';
    (writer->buffer + uVar2)[1] = '?';
    writer->bufsize = uVar2 + 2;
    pcVar5 = ":anonymous";
    if (node->name != (char_t *)0x0) {
      pcVar5 = node->name;
    }
    xml_buffered_writer::write_string(writer,pcVar5);
    node_output_attributes(writer,node,"",0,flags | 4,0);
LAB_001354a3:
    sVar4 = writer->bufsize;
    break;
  case 8:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x44);
    xml_buffered_writer::write(writer,0x54,(void *)0x59,0x50);
    if (node->value != (char_t *)0x0) {
      uVar2 = writer->bufsize;
      if (0x7ff < uVar2) {
        xml_buffered_writer::flush(writer,writer->buffer,uVar2);
        uVar2 = 0;
      }
      writer->buffer[uVar2] = ' ';
      writer->bufsize = uVar2 + 1;
      xml_buffered_writer::write_string(writer,node->value);
    }
    uVar2 = writer->bufsize;
    if (0x7ff < uVar2) {
      xml_buffered_writer::flush(writer,writer->buffer,uVar2);
      uVar2 = 0;
    }
    writer->buffer[uVar2] = '>';
    sVar4 = uVar2 + 1;
    goto LAB_001358c6;
  default:
    __assert_fail("false && \"Invalid node type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1093,
                  "void pugi::impl::(anonymous namespace)::node_output_simple(xml_buffered_writer &, xml_node_struct *, unsigned int)"
                 );
  }
  if (0x7fe < sVar4) {
    xml_buffered_writer::flush(writer,writer->buffer,sVar4);
    sVar4 = 0;
  }
  (writer->buffer + sVar4)[0] = '?';
  (writer->buffer + sVar4)[1] = '>';
  sVar4 = sVar4 + 2;
LAB_001358c6:
  writer->bufsize = sVar4;
  return;
LAB_00135516:
  uVar2 = writer->bufsize + sVar4;
  if (uVar2 < 0x801) {
    memcpy(writer->buffer + writer->bufsize,pcVar5,sVar4);
    writer->bufsize = uVar2;
  }
  else {
    xml_buffered_writer::write_direct(writer,pcVar5,sVar4);
  }
  if (*pcVar6 != '-') {
    if (*pcVar6 != '\0') {
      __assert_fail("*s == \'-\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0xfdc,
                    "void pugi::impl::(anonymous namespace)::node_output_comment(xml_buffered_writer &, const char_t *)"
                   );
    }
    goto LAB_0013589a;
  }
  uVar2 = writer->bufsize;
  if (0x7fe < uVar2) {
    xml_buffered_writer::flush(writer,writer->buffer,uVar2);
    uVar2 = 0;
  }
  (writer->buffer + uVar2)[0] = '-';
  (writer->buffer + uVar2)[1] = ' ';
  writer->bufsize = uVar2 + 2;
  pcVar5 = pcVar8;
  goto LAB_001354de;
LAB_00135761:
  uVar7 = (ulong)((uint)(cVar1 != '\0') * 2);
  sVar4 = lVar3 + uVar7;
  uVar2 = sVar4 + writer->bufsize;
  if (uVar2 < 0x801) {
    memcpy(writer->buffer + writer->bufsize,pcVar5,sVar4);
    writer->bufsize = uVar2;
  }
  else {
    xml_buffered_writer::write_direct(writer,pcVar5,sVar4);
    uVar2 = writer->bufsize;
  }
  if (0x7fd < uVar2) {
    xml_buffered_writer::flush(writer,writer->buffer,uVar2);
    uVar2 = 0;
  }
  (writer->buffer + uVar2)[0] = ']';
  (writer->buffer + uVar2)[1] = ']';
  writer->buffer[uVar2 + 2] = '>';
  writer->bufsize = uVar2 + 3;
  pcVar5 = pcVar6 + uVar7;
  if (pcVar6[uVar7] == '\0') {
    return;
  }
  goto LAB_001356f7;
LAB_0013563d:
  if (sVar4 + length < 0x801) {
    memcpy(writer->buffer + sVar4,pcVar6,length);
    writer->bufsize = sVar4 + length;
  }
  else {
    xml_buffered_writer::write_direct(writer,pcVar6,length);
  }
  if (pcVar9[-2] == '?') {
    if (pcVar9[-1] == '>') {
      uVar2 = writer->bufsize;
      if (0x7fd < uVar2) {
        xml_buffered_writer::flush(writer,writer->buffer,uVar2);
        uVar2 = 0;
      }
      (writer->buffer + uVar2)[0] = '?';
      (writer->buffer + uVar2)[1] = ' ';
      writer->buffer[uVar2 + 2] = '>';
      sVar4 = uVar2 + 3;
      writer->bufsize = sVar4;
      pcVar6 = pcVar9;
      goto LAB_00135606;
    }
  }
  else if (pcVar9[-2] == '\0') goto LAB_001354a3;
  __assert_fail("s[0] == \'?\' && s[1] == \'>\'",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                ,0xff3,
                "void pugi::impl::(anonymous namespace)::node_output_pi_value(xml_buffered_writer &, const char_t *)"
               );
}

Assistant:

PUGI__FN void node_output_simple(xml_buffered_writer& writer, xml_node_struct* node, unsigned int flags)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		switch (PUGI__NODETYPE(node))
		{
			case node_pcdata:
				text_output(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""), ctx_special_pcdata, flags);
				break;

			case node_cdata:
				text_output_cdata(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_comment:
				node_output_comment(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_pi:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);

				if (node->value)
				{
					writer.write(' ');
					node_output_pi_value(writer, node->value);
				}

				writer.write('?', '>');
				break;

			case node_declaration:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);
				node_output_attributes(writer, node, PUGIXML_TEXT(""), 0, flags | format_raw, 0);
				writer.write('?', '>');
				break;

			case node_doctype:
				writer.write('<', '!', 'D', 'O', 'C');
				writer.write('T', 'Y', 'P', 'E');

				if (node->value)
				{
					writer.write(' ');
					writer.write_string(node->value);
				}

				writer.write('>');
				break;

			default:
				assert(false && "Invalid node type"); // unreachable
		}
	}